

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOf_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::IsPartOf_PDU::Encode(IsPartOf_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  IsPartOf_PDU *this_local;
  
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  pKVar1 = DATA_TYPE::operator<<(stream,&(this->m_RelRec).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_LocPrt).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_NmLocID).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar1,&(this->m_PrtTyp).super_DataTypeBase);
  return;
}

Assistant:

void IsPartOf_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << KDIS_STREAM m_RelRec
           << KDIS_STREAM m_LocPrt
           << KDIS_STREAM m_NmLocID
           << KDIS_STREAM m_PrtTyp;
}